

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::registerPropertyStrings(Generator *this)

{
  bool bVar1;
  long lVar2;
  PropertyDef *p;
  PropertyDef *s;
  
  s = (this->cdef->propertyList).d.ptr;
  for (lVar2 = (this->cdef->propertyList).d.size * 0x158; lVar2 != 0; lVar2 = lVar2 + -0x158) {
    strreg(this,&s->name);
    bVar1 = isBuiltinType(&s->type);
    if (!bVar1) {
      strreg(this,&s->type);
    }
    s = s + 1;
  }
  return;
}

Assistant:

void Generator::registerPropertyStrings()
{
    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        strreg(p.name);
        if (!isBuiltinType(p.type))
            strreg(p.type);
    }
}